

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O2

void printf_test(void)

{
  array_container_t *arr;
  
  arr = array_container_create();
  _assert_true((unsigned_long)arr,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x17);
  array_container_add(arr,1);
  array_container_add(arr,2);
  array_container_add(arr,3);
  array_container_add(arr,10);
  array_container_add(arr,10000);
  array_container_printf(arr);
  putchar(10);
  array_container_free(arr);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    array_container_add(B, 1U);
    array_container_add(B, 2U);
    array_container_add(B, 3U);
    array_container_add(B, 10U);
    array_container_add(B, 10000U);

    array_container_printf(B);
    printf("\n");

    array_container_free(B);
}